

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InvertDatabase.cc
# Opt level: O3

void __thiscall
InvertDatabase::get_l2file(InvertDatabase *this,string *fname,char use_seq,int *l2cnt)

{
  EqGrNode *pEVar1;
  undefined1 auVar2 [16];
  char cVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  unsigned_long flen;
  int *piVar8;
  runtime_error *prVar9;
  int iVar10;
  long lVar11;
  fstream file;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  long local_240 [4];
  byte abStack_220 [496];
  
  std::fstream::fstream(local_240,(fname->_M_dataplus)._M_p,_S_bin);
  cVar3 = std::__basic_file<char>::is_open();
  if (cVar3 == '\0') {
    prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar9,"can\'t open l2 file");
    __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  flen = file_size((fstream *)local_240);
  if (flen != 0) {
    piVar8 = read_file((fstream *)local_240,flen);
    if ((abStack_220[*(long *)(local_240[0] + -0x18)] & 5) != 0) {
      prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::operator+(&local_260,"Error reading file ",fname);
      std::runtime_error::runtime_error(prVar9,(string *)&local_260);
      __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::fstream::close();
    auVar2._8_8_ = 0;
    auVar2._0_8_ = flen;
    iVar5 = SUB164(auVar2 / ZEXT816(4),0);
    if (0 < iVar5) {
      lVar11 = 0;
      do {
        iVar10 = 0;
        do {
          iVar6 = ClassInfo::get_num_class
                            ((this->cls).super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr);
          if (iVar6 <= iVar10) goto LAB_00110f2b;
          iVar6 = piVar8[lVar11 + 2];
          iVar7 = ClassInfo::get_min_support
                            ((this->cls).super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr,iVar10);
          iVar10 = iVar10 + 1;
        } while (iVar6 < iVar7);
        bVar4 = extl2_pre_pruning(this,piVar8[lVar11 + 2],piVar8[lVar11 + 1],piVar8[lVar11],use_seq,
                                  &vuint_null);
        if (!bVar4) {
          suffix_add_item_eqgraph(this,use_seq,piVar8[lVar11],piVar8[lVar11 + 1]);
          *l2cnt = *l2cnt + 1;
          pEVar1 = (this->eqgraph).
                   super__Vector_base<std::shared_ptr<EqGrNode>,_std::allocator<std::shared_ptr<EqGrNode>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[piVar8[lVar11 + 1]].
                   super___shared_ptr<EqGrNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          if (use_seq == '\0') {
            EqGrNode::add_sup(pEVar1,piVar8[lVar11 + 2],0);
          }
          else {
            EqGrNode::add_seqsup(pEVar1,piVar8[lVar11 + 2],0);
          }
          for (iVar10 = 1;
              iVar6 = ClassInfo::get_num_class
                                ((this->cls).
                                 super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr),
              iVar10 < iVar6; iVar10 = iVar10 + 1) {
            pEVar1 = (this->eqgraph).
                     super__Vector_base<std::shared_ptr<EqGrNode>,_std::allocator<std::shared_ptr<EqGrNode>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[piVar8[lVar11 + 1]].
                     super___shared_ptr<EqGrNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            if (use_seq == '\0') {
              EqGrNode::add_sup(pEVar1,0,iVar10);
            }
            else {
              EqGrNode::add_seqsup(pEVar1,0,iVar10);
            }
          }
        }
LAB_00110f2b:
        lVar11 = lVar11 + 3;
      } while ((int)lVar11 < iVar5);
    }
    if (piVar8 != (int *)0x0) {
      operator_delete__(piVar8);
    }
  }
  std::fstream::~fstream(local_240);
  return;
}

Assistant:

void InvertDatabase::get_l2file(const string& fname, char use_seq, int &l2cnt) {
    fstream file(fname.c_str(), ios::binary);
    if (!file.is_open()) {
        throw runtime_error("can't open l2 file");
    }
    unsigned long flen = file_size(file);
    if (flen > 0) {
        int *cntary = read_file(file, flen);

        if (!file) {
            throw runtime_error("Error reading file " + fname);
        }
        file.close();

        // build eqgraph -- large 2-itemset relations
        int lim = flen / INT_SIZE;
        char lflg = 0;
        int i, j;
        for (i = 0; i < lim; i += 3) {
            lflg = 0;
            for (j = 0; j < cls->get_num_class(); j++) {
                if (cntary[i + 2] >= cls->get_min_support(j)) {
                    lflg = 1;
                    break;
                }
            }
            if (lflg) {
                if (!extl2_pre_pruning(cntary[i + 2], cntary[i + 1], cntary[i], use_seq, vuint_null)) {
                    suffix_add_item_eqgraph(use_seq, cntary[i], cntary[i + 1]);
                    l2cnt++;
                    //assign sup to a single class, sice we don't know breakup
                    if (use_seq) eqgraph[cntary[i + 1]]->add_seqsup(cntary[i + 2], 0);
                    else eqgraph[cntary[i + 1]]->add_sup(cntary[i + 2], 0);
                    for (j = 1; j < cls->get_num_class(); j++)
                        if (use_seq) eqgraph[cntary[i + 1]]->add_seqsup(0, j);
                        else eqgraph[cntary[i + 1]]->add_sup(0, j);
                }
            }
        }

        delete [] cntary;
    }
}